

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

Interface * __thiscall
gl4cts::EnhancedLayouts::Utils::ProgramInterface::CloneBlockForStage
          (ProgramInterface *this,Interface *block,STAGES stage,STORAGE storage,GLchar *prefix)

{
  pointer pcVar1;
  __normal_iterator<gl4cts::EnhancedLayouts::Utils::Interface_**,_std::vector<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>_>
  _Var2;
  Interface *this_00;
  string name;
  size_t position;
  string local_58;
  size_t local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pcVar1 = (block->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar1,pcVar1 + (block->m_name)._M_string_length);
  local_38 = 0;
  replaceToken(prefix,&local_38,GetStagePrefix::lut[stage][storage],&local_58);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<gl4cts::EnhancedLayouts::Utils::Interface**,std::vector<gl4cts::EnhancedLayouts::Utils::Interface*,std::allocator<gl4cts::EnhancedLayouts::Utils::Interface*>>>,__gnu_cxx::__ops::_Iter_pred<gl4cts::EnhancedLayouts::Utils::matchInterfaceName>>
                    ((this->m_blocks).
                     super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_blocks).
                     super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,local_58._M_dataplus._M_p);
  if (((this->m_blocks).
       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
       ._M_impl.super__Vector_impl_data._M_finish == _Var2._M_current) ||
     (this_00 = *_Var2._M_current, this_00 == (Interface *)0x0)) {
    this_00 = AddInterface(this,local_58._M_dataplus._M_p,BLOCK);
  }
  std::
  vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
  ::operator=(&this_00->m_members,&block->m_members);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return this_00;
}

Assistant:

Interface* ProgramInterface::CloneBlockForStage(const Interface& block, Shader::STAGES stage, Variable::STORAGE storage,
												const GLchar* prefix)
{
	/* Get name */
	std::string name = block.m_name;

	/* Prefix name with stage ID */
	size_t		  position	 = 0;
	const GLchar* stage_prefix = GetStagePrefix(stage, storage);
	Utils::replaceToken(prefix, position, stage_prefix, name);

	Interface* ptr = GetBlock(name.c_str());

	if (0 == ptr)
	{
		ptr = AddInterface(name.c_str(), Interface::BLOCK);
	}

	ptr->m_members = block.m_members;

	return ptr;
}